

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

void TargetFilesystemArtifactDependencyCMP0112::AddDependency
               (cmGeneratorTarget *target,cmGeneratorExpressionContext *context)

{
  cmLocalGenerator *this;
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  string *args;
  cmake *this_01;
  PolicyID id;
  cmGeneratorTarget *target_local;
  string err;
  string local_40;
  
  target_local = target;
  std::
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  ::_M_insert_unique<cmGeneratorTarget_const*const&>
            ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              *)&context->AllTargets,&target_local);
  this = context->LG;
  PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0112(target_local);
  if (PVar2 != OLD) {
    if (PVar2 != WARN) {
      return;
    }
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"CMAKE_POLICY_WARNING_CMP0112",(allocator<char> *)&local_40);
    bVar1 = cmMakefile::PolicyOptionalWarningEnabled(this_00,&err);
    std::__cxx11::string::~string((string *)&err);
    if (bVar1) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_40,(cmPolicies *)0x70,id);
      args = cmGeneratorTarget::GetName_abi_cxx11_(target_local);
      cmStrCat<std::__cxx11::string,char_const(&)[39],std::__cxx11::string_const&,char_const(&)[3]>
                (&err,&local_40,(char (*) [39])"\nDependency being added to target:\n  \"",args,
                 (char (*) [3])0x761a8d);
      std::__cxx11::string::~string((string *)&local_40);
      this_01 = cmLocalGenerator::GetCMakeInstance(this);
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&err,&context->Backtrace);
      std::__cxx11::string::~string((string *)&err);
    }
  }
  std::
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  ::_M_insert_unique<cmGeneratorTarget*const&>
            ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
              *)&context->DependTargets,&target_local);
  return;
}

Assistant:

static void AddDependency(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context)
  {
    context->AllTargets.insert(target);
    cmLocalGenerator* lg = context->LG;
    switch (target->GetPolicyStatusCMP0112()) {
      case cmPolicies::WARN:
        if (lg->GetMakefile()->PolicyOptionalWarningEnabled(
              "CMAKE_POLICY_WARNING_CMP0112")) {
          std::string err =
            cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0112),
                     "\nDependency being added to target:\n  \"",
                     target->GetName(), "\"\n");
          lg->GetCMakeInstance()->IssueMessage(MessageType ::AUTHOR_WARNING,
                                               err, context->Backtrace);
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        context->DependTargets.insert(target);
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        break;
    }
  }